

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

iter_type __thiscall
booster::locale::impl_icu::num_format<wchar_t>::do_real_put<double>
          (num_format<wchar_t> *this,iter_type out,ios_base *ios,char_type_conflict fill,double val)

{
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __first;
  undefined1 uVar1;
  fmtflags __a;
  _Ios_Fmtflags _Var2;
  pointer pfVar3;
  streamsize sVar4;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *poVar5;
  ios_base *in_RCX;
  undefined1 in_DL;
  undefined1 extraout_DL;
  undefined8 extraout_RDX;
  streambuf_type *in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  bool bVar7;
  undefined4 in_XMM0_Da;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> oVar8;
  iter_type iVar9;
  fmtflags flags;
  streamsize n;
  streamsize points;
  streamsize on_right;
  streamsize on_left;
  string_type *str;
  size_t code_points;
  formatter_ptr formatter;
  string *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  ios_base *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined7 in_stack_fffffffffffffee0;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef1;
  long local_d0;
  long local_c8;
  wstring local_c0 [32];
  wstring *local_a0;
  long local_98;
  undefined4 local_8c;
  streambuf_type *local_88;
  undefined1 local_80;
  streambuf_type *local_78;
  byte local_61;
  undefined4 local_40;
  undefined4 local_34;
  ios_base *local_30;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> local_20;
  streambuf_type *local_10;
  undefined8 local_8;
  streambuf_type *psVar6;
  
  local_34 = in_R8D;
  local_30 = in_RCX;
  local_20._M_sbuf = in_RSI;
  local_20._M_failed = (bool)in_DL;
  local_40 = in_XMM0_Da;
  std::
  unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,std::default_delete<booster::locale::impl_icu::formatter<wchar_t>>>
  ::unique_ptr<std::default_delete<booster::locale::impl_icu::formatter<wchar_t>>,void>
            ((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
              *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  local_61 = 0;
  uVar1 = num_base::use_parent<double>
                    (in_stack_fffffffffffffea8,
                     (double)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  bVar7 = true;
  if (!(bool)uVar1) {
    formatter<wchar_t>::create
              (in_stack_fffffffffffffea8,
               (Locale *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98);
    local_61 = 1;
    std::
    unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
    ::operator=((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                 *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                (unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                 *)in_stack_fffffffffffffe98);
    pfVar3 = std::
             unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
             ::get((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                    *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    bVar7 = pfVar3 == (pointer)0x0;
  }
  if ((local_61 & 1) != 0) {
    std::
    unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
    ::~unique_ptr((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                   *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  }
  if (bVar7) {
    local_78 = local_20._M_sbuf;
    local_88 = (streambuf_type *)
               std::num_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
               do_put(local_40,in_RDI,local_20._M_sbuf,
                      CONCAT71(local_20._9_7_,local_20._M_failed) & 0xffffffff,local_30,local_34);
    local_8 = CONCAT71(local_8._1_7_,extraout_DL);
    local_8c = 1;
    local_80 = extraout_DL;
    local_10 = local_88;
  }
  else {
    pfVar3 = std::
             unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
             ::operator->((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                           *)0x277e59);
    (*(pfVar3->super_base_formatter)._vptr_base_formatter[2])(local_40,local_c0,pfVar3,&local_98);
    local_a0 = local_c0;
    local_c8 = 0;
    local_d0 = 0;
    sVar4 = std::ios_base::width(local_30);
    if (local_98 < sVar4) {
      sVar4 = std::ios_base::width(local_30);
      __a = std::ios_base::flags(local_30);
      _Var2 = std::operator&(__a,_S_adjustfield);
      if (_Var2 != _S_left) {
        local_c8 = sVar4 - local_98;
      }
      local_d0 = (sVar4 - local_98) - local_c8;
    }
    for (; 0 < local_c8; local_c8 = local_c8 + -1) {
      in_stack_fffffffffffffeb4 = local_34;
      poVar5 = std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator++
                         (&local_20,0);
      std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator*(poVar5);
      std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=
                ((ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (wchar_t)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    }
    std::__cxx11::wstring::begin();
    std::__cxx11::wstring::end();
    __first._M_current._1_7_ = in_stack_fffffffffffffef1;
    __first._M_current._0_1_ = in_stack_fffffffffffffef0;
    oVar8._8_7_ = in_stack_fffffffffffffee0;
    oVar8._M_sbuf = (streambuf_type *)in_RDI;
    oVar8._15_1_ = uVar1;
    oVar8 = std::
            copy<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>
                      (__first,in_stack_fffffffffffffee8,oVar8);
    psVar6 = oVar8._M_sbuf;
    in_stack_fffffffffffffea4 = CONCAT13(oVar8._M_failed,(int3)in_stack_fffffffffffffea4);
    for (; 0 < local_d0; local_d0 = local_d0 + -1) {
      in_stack_fffffffffffffea0 = local_34;
      poVar5 = std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator++
                         (&local_20,0);
      std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator*(poVar5);
      std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=
                ((ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (wchar_t)((ulong)psVar6 >> 0x20));
    }
    std::ios_base::width(local_30,0);
    local_10 = local_20._M_sbuf;
    local_8 = CONCAT71(local_20._9_7_,local_20._M_failed);
    local_8c = 1;
    std::__cxx11::wstring::~wstring(local_c0);
  }
  std::
  unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
  ::~unique_ptr((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                 *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  iVar9._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  iVar9._M_failed = (bool)(undefined1)local_8;
  iVar9._M_sbuf = local_10;
  return iVar9;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        formatter_ptr formatter;
        
        if(use_parent<ValueType>(ios,val) || (formatter = formatter_type::create(ios,loc_,enc_)).get() == 0) {
            return std::num_put<char_type>::do_put(out,ios,fill,val);
        }
        
        size_t code_points;
        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type const &str = formatter->format(static_cast<cast_type>(val),code_points);
        std::streamsize on_left=0,on_right = 0,points = code_points;
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // We do not really know internal point, so we assume that it does not
            // exist. So according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;

    }